

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void jmp_short(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  char cVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  int iVar11;
  char *pFormat;
  UInt64 UVar12;
  
  (pMyDisasm->Instruction).Category = 0x10006;
  (pMyDisasm->Instruction).BranchType = 0xb;
  (pMyDisasm->Operand1).OpSize = 8;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"jmp",4);
  iVar11 = Security(2,pMyDisasm);
  if (iVar11 == 0) {
    return;
  }
  UVar12 = (pMyDisasm->Reserved_).EIP_VA;
  cVar3 = *(char *)((pMyDisasm->Reserved_).EIP_ + 1);
  (pMyDisasm->Reserved_).RelativeAddress = 1;
  if (UVar12 == 0) {
    UVar12 = (pMyDisasm->Reserved_).EIP_REAL;
  }
  UVar12 = UVar12 + (long)cVar3 + (long)(pMyDisasm->Reserved_).NB_PREFIX + 2;
  if ((pMyDisasm->Reserved_).OperandSize == 0x10) {
    UVar12 = UVar12 & 0xffff;
  }
  else if (UVar12 >> 0x20 != 0) {
    pFormat = "%.16llX";
    goto LAB_0011481c;
  }
  pFormat = "%.8X";
LAB_0011481c:
  CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand1).OpMnemonic,pFormat,UVar12);
  (pMyDisasm->Operand1).OpType = 0x4040000;
  (pMyDisasm->Operand1).AccessMode = 1;
  (pMyDisasm->Instruction).AddrValue = UVar12;
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 2;
  pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar4 = EFLAGS_TABLE[0x31].SF_;
  UVar5 = EFLAGS_TABLE[0x31].ZF_;
  UVar6 = EFLAGS_TABLE[0x31].AF_;
  UVar7 = EFLAGS_TABLE[0x31].PF_;
  UVar8 = EFLAGS_TABLE[0x31].CF_;
  UVar9 = EFLAGS_TABLE[0x31].TF_;
  UVar10 = EFLAGS_TABLE[0x31].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x31].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar4;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar5;
  (pMyDisasm->Instruction).Flags.AF_ = UVar6;
  (pMyDisasm->Instruction).Flags.PF_ = UVar7;
  (pMyDisasm->Instruction).Flags.CF_ = UVar8;
  (pMyDisasm->Instruction).Flags.TF_ = UVar9;
  (pMyDisasm->Instruction).Flags.IF_ = UVar10;
  UVar4 = EFLAGS_TABLE[0x31].NT_;
  UVar5 = EFLAGS_TABLE[0x31].RF_;
  UVar6 = EFLAGS_TABLE[0x31].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x31].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar4;
  (pMyDisasm->Instruction).Flags.RF_ = UVar5;
  (pMyDisasm->Instruction).Flags.alignment = UVar6;
  return;
}

Assistant:

void __bea_callspec__ jmp_short(PDISASM pMyDisasm)
{
    UInt64 MyAddress = 0;
    signed long MyNumber = 0;
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+CONTROL_TRANSFER;
    pMyDisasm->Instruction.BranchType = JmpType;
    pMyDisasm->Operand1.OpSize = 8;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "jmp");
    #endif
    if (!Security(2, pMyDisasm)) return;
    MyNumber = *((Int8*) (GV.EIP_+1));
    CalculateRelativeAddress(&MyAddress,(Int64) GV.NB_PREFIX+2+MyNumber, pMyDisasm);
    if (GV.OperandSize == 16) MyAddress = MyAddress & 0xffff;
    if (MyAddress >= W64LIT (0x100000000)) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand1.OpMnemonic, "%.16llX",(Int64) MyAddress);
        #endif
    }
    else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand1.OpMnemonic, "%.8X",(Int64) MyAddress);
        #endif
    }
    pMyDisasm->Operand1.OpType = CONSTANT_TYPE+RELATIVE_;
    pMyDisasm->Operand1.AccessMode = READ;
    pMyDisasm->Instruction.AddrValue = MyAddress;
    GV.EIP_+=2;
    FillFlags(pMyDisasm,49);
}